

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

const_iterator * __thiscall
llvm::sys::path::begin(const_iterator *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  Style style_00;
  StringRef SVar1;
  const_iterator *i;
  char *local_30;
  size_t local_28;
  Style style_local;
  StringRef path_local;
  
  style_00 = (Style)path.Length;
  const_iterator::const_iterator(__return_storage_ptr__);
  (__return_storage_ptr__->Path).Data = (char *)this;
  (__return_storage_ptr__->Path).Length = (size_t)path.Data;
  SVar1.Length._4_4_ = 0;
  SVar1._0_12_ = path._0_12_;
  SVar1 = anon_unknown.dwarf_3697931::find_first_component
                    ((anon_unknown_dwarf_3697931 *)this,SVar1,style_00);
  local_30 = SVar1.Data;
  (__return_storage_ptr__->Component).Data = local_30;
  local_28 = SVar1.Length;
  (__return_storage_ptr__->Component).Length = local_28;
  __return_storage_ptr__->Position = 0;
  __return_storage_ptr__->S = (Style)path.Length;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin(StringRef path, Style style) {
  const_iterator i;
  i.Path      = path;
  i.Component = find_first_component(path, style);
  i.Position  = 0;
  i.S = style;
  return i;
}